

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O2

void myarimatest(void)

{
  int iVar1;
  FILE *__stream;
  double *x;
  long lVar2;
  myarima_object obj;
  long lVar3;
  ulong uVar4;
  double dStack_25c8;
  double temp [1200];
  int local_38 [2];
  int order [3];
  int rmethod;
  
  local_38[0] = 1;
  local_38[1] = 1;
  order[0] = 1;
  temp[0x4af] = 0.0;
  order[1] = 0;
  __stream = fopen("../data/seriesB.txt","r");
  if (__stream != (FILE *)0x0) {
    uVar4 = 0;
    lVar3 = 0;
    while( true ) {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      __isoc99_fscanf(__stream,"%lf \n",(long)temp + (uVar4 - 8));
      lVar3 = lVar3 + 1;
      uVar4 = uVar4 + 8;
    }
    x = (double *)malloc(uVar4 & 0x7fffffff8);
    for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 1) {
      x[lVar2] = temp[lVar2 + -1];
    }
    obj = myarima(x,(int)lVar3,local_38,(int *)(temp + 0x4af),0,"aic",0,0,0.0,(double *)0x0,0,
                  order + 1);
    myarima_summary(obj);
    myarima_free(obj);
    free(x);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void myarimatest() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	int drift,biasadj,method;
	double *xpred, *amse,*xreg,*newxreg;
	myarima_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 1;
	d = 1;
	q = 1;
	s = 0;
	P = 0;
	D = 0;
	Q = 0;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[4] = {P,D,Q,s};
	const char *ic = "aic";
	int trace = 0;
	int constant = 0;
	int approx = 0;
	double offset = 0;
	int rmethod = 0;


	L = 0;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }

	drift = 1;
	biasadj = 0;
	method = 0;

	//obj = sarimax_init(p, d, q, P, D, Q, s, r , N);
	obj = myarima(inp,N,order,seasonal, constant, ic, trace, approx, offset,NULL, r, &rmethod) ;

	myarima_summary(obj);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	//sarimax_setMethod(obj, 0); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	//sarimax_exec(obj, inp,xreg);
	

	myarima_free(obj);
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
}